

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O2

void Js::VariableWalkerBase::GetReturnedValueResolvedObject
               (ReturnedValue *returnValue,DiagStackFrame *frame,ResolvedObject *pResolvedObject)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  BOOL BVar4;
  charcount_t displayNameBufferLength;
  JavascriptString *in_RAX;
  ArenaAllocator *alloc;
  LPCWSTR string;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  LocalObjectAddressForRegSlot *this;
  FunctionBody *pFVar5;
  undefined4 extraout_var_01;
  char16 *pcVar6;
  Var pvVar7;
  undefined4 *puVar8;
  IDiagObjectModelDisplay *pIVar9;
  undefined8 uVar10;
  JavascriptString *local_38;
  JavascriptString *displayName;
  
  local_38 = in_RAX;
  alloc = GetArenaFromContext(pResolvedObject->scriptContext);
  string = (LPCWSTR)new__<Memory::ArenaAllocator>(0x1fe,alloc,0x35916e);
  if (returnValue->isValueOfReturnStatement == true) {
    swprintf_s((char16_t_conflict *)string,0xff,(char16_t_conflict *)L"[Return value]");
    iVar3 = (*frame->_vptr_DiagStackFrame[5])(frame,0,0);
    pResolvedObject->obj = (Var)CONCAT44(extraout_var,iVar3);
    iVar3 = (*frame->_vptr_DiagStackFrame[0xe])(frame);
    this = (LocalObjectAddressForRegSlot *)
           new<Memory::ArenaAllocator>
                     (0x20,(ArenaAllocator *)CONCAT44(extraout_var_00,iVar3),0x35916e);
    LocalObjectAddressForRegSlot::LocalObjectAddressForRegSlot(this,frame,0,pResolvedObject->obj);
    pResolvedObject->address = (IDiagObjectAddress *)this;
    pvVar7 = pResolvedObject->obj;
    uVar10 = 0x8000020;
  }
  else {
    BVar4 = JavascriptFunction::IsScriptFunction((returnValue->calledFunction).ptr);
    if (BVar4 == 0) {
      EnterPinnedScope(&local_38);
      local_38 = JavascriptFunction::GetDisplayName((returnValue->calledFunction).ptr);
      pcVar6 = JavascriptString::GetString(local_38);
      displayNameBufferLength = JavascriptString::GetLength(local_38);
      pcVar6 = ParseFunctionName(pcVar6,displayNameBufferLength,pResolvedObject->scriptContext);
      swprintf_s((char16_t_conflict *)string,0xff,(char16_t_conflict *)L"[%s returned]",pcVar6);
      LeavePinnedScope();
    }
    else {
      pFVar5 = JavascriptFunction::GetFunctionBody((returnValue->calledFunction).ptr);
      iVar3 = (*(pFVar5->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(pFVar5);
      swprintf_s((char16_t_conflict *)string,0xff,(char16_t_conflict *)L"[%s returned]",
                 CONCAT44(extraout_var_01,iVar3));
    }
    pvVar7 = (returnValue->returnedValue).ptr;
    pResolvedObject->obj = pvVar7;
    pResolvedObject->address = (IDiagObjectAddress *)0x0;
    uVar10 = 0x8000820;
  }
  if (pvVar7 == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0xf2,"(pResolvedObject->obj != nullptr)",
                                "pResolvedObject->obj != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar8 = 0;
  }
  pResolvedObject->name = string;
  pResolvedObject->typeId = TypeIds_Object;
  pIVar9 = ResolvedObject::CreateDisplay(pResolvedObject);
  pResolvedObject->objectDisplay = pIVar9;
  (*pIVar9->_vptr_IDiagObjectModelDisplay[6])(pIVar9,uVar10);
  return;
}

Assistant:

void VariableWalkerBase::GetReturnedValueResolvedObject(ReturnedValue * returnValue, DiagStackFrame* frame, ResolvedObject* pResolvedObject)
    {
        DBGPROP_ATTRIB_FLAGS defaultAttributes = DBGPROP_ATTRIB_VALUE_IS_RETURN_VALUE | DBGPROP_ATTRIB_VALUE_IS_FAKE;
        WCHAR * finalName = AnewArray(GetArenaFromContext(pResolvedObject->scriptContext), WCHAR, RETURN_VALUE_MAX_NAME);
        if (returnValue->isValueOfReturnStatement)
        {
            swprintf_s(finalName, RETURN_VALUE_MAX_NAME, _u("[Return value]"));
            pResolvedObject->obj = frame->GetRegValue(Js::FunctionBody::ReturnValueRegSlot);
            pResolvedObject->address = Anew(frame->GetArena(), LocalObjectAddressForRegSlot, frame, Js::FunctionBody::ReturnValueRegSlot, pResolvedObject->obj);
        }
        else
        {
            if (returnValue->calledFunction->IsScriptFunction())
            {
                swprintf_s(finalName, RETURN_VALUE_MAX_NAME, _u("[%s returned]"), returnValue->calledFunction->GetFunctionBody()->GetDisplayName());
            }
            else
            {
                ENTER_PINNED_SCOPE(JavascriptString, displayName);
                displayName = returnValue->calledFunction->GetDisplayName();

                const char16 *builtInName = ParseFunctionName(displayName->GetString(), displayName->GetLength(), pResolvedObject->scriptContext);
                swprintf_s(finalName, RETURN_VALUE_MAX_NAME, _u("[%s returned]"), builtInName);

                LEAVE_PINNED_SCOPE();
            }
            pResolvedObject->obj = returnValue->returnedValue;
            defaultAttributes |= DBGPROP_ATTRIB_VALUE_READONLY;
            pResolvedObject->address = nullptr;
        }
        Assert(pResolvedObject->obj != nullptr);

        pResolvedObject->name = finalName;
        pResolvedObject->typeId = TypeIds_Object;

        pResolvedObject->objectDisplay = pResolvedObject->CreateDisplay();
        pResolvedObject->objectDisplay->SetDefaultTypeAttribute(defaultAttributes);
    }